

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::SingleArena_CopyConstructEmpty_Test::TestBody
          (SingleArena_CopyConstructEmpty_Test *this)

{
  TaggedStringPtr TVar1;
  char *message;
  pointer *__ptr;
  char *in_R9;
  AssertHelper local_88;
  unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> arena;
  AssertHelper local_78;
  AssertionResult gtest_ar_;
  ArenaStringPtr field;
  AssertionResult gtest_ar;
  ArenaStringPtr dst;
  string empty;
  
  empty._M_dataplus._M_p = (pointer)&empty.field_2;
  empty._M_string_length = 0;
  empty.field_2._M_local_buf[0] = '\0';
  SingleArena::GetArena((SingleArena *)&arena);
  internal::TaggedStringPtr::SetDefault(&field.tagged_ptr_,&empty);
  TVar1 = internal::TaggedStringPtr::Copy
                    (&field.tagged_ptr_,
                     (Arena *)arena._M_t.
                              super___uniq_ptr_impl<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::Arena_*,_std::default_delete<google::protobuf::Arena>_>
                              .super__Head_base<0UL,_google::protobuf::Arena_*,_false>._M_head_impl)
  ;
  message = anon_var_dwarf_651463 + 5;
  dst.tagged_ptr_ = TVar1;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[1]>
            ((internal *)&gtest_ar,"dst.Get()","\"\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)TVar1.ptr_ & 0xfffffffffffffffc),(char (*) [1])(anon_var_dwarf_651463 + 5));
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring_unittest.cc"
               ,0x8a,message);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = ((ulong)TVar1.ptr_ & 3) == 0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"dst.IsDefault()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring_unittest.cc"
               ,0x8e,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (local_88.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_88.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  if ((__uniq_ptr_impl<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>)
      arena._M_t.
      super___uniq_ptr_impl<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>.
      _M_t.
      super__Tuple_impl<0UL,_google::protobuf::Arena_*,_std::default_delete<google::protobuf::Arena>_>
      .super__Head_base<0UL,_google::protobuf::Arena_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>)0x0)
  {
    internal::ArenaStringPtr::Destroy(&dst);
  }
  internal::ArenaStringPtr::Destroy(&field);
  std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>::
  ~unique_ptr(&arena);
  std::__cxx11::string::~string((string *)&empty);
  return;
}

Assistant:

TEST_P(SingleArena, CopyConstructEmpty) {
  std::string empty;
  auto arena = GetArena();
  ArenaStringPtr field;
  field.InitExternal(&empty);

  ArenaStringPtr dst(arena.get(), field);
  EXPECT_EQ(dst.Get(), "");
  if (internal::DebugHardenForceCopyDefaultString()) {
    EXPECT_FALSE(dst.IsDefault());
  } else {
    EXPECT_TRUE(dst.IsDefault());
  }
  if (arena == nullptr) dst.Destroy();
  field.Destroy();
}